

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O1

int __thiscall xe::TcpIpLink::connect(TcpIpLink *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  TcpIpLinkState *this_00;
  deSocketState dVar1;
  CommLinkState CVar2;
  deBool dVar3;
  Error *pEVar4;
  sockaddr *__addr_00;
  
  dVar1 = deSocket_getState((this->m_socket).m_socket);
  if (dVar1 == DE_SOCKETSTATE_CLOSED) {
    this_00 = &this->m_state;
    CVar2 = TcpIpLinkState::getState(this_00);
    if (CVar2 == COMMLINKSTATE_ERROR) {
      if ((this->m_sendThread).m_isRunning == true) {
        pEVar4 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(pEVar4,(char *)0x0,"!m_sendThread.isRunning()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                     ,0x1ce);
      }
      else {
        if ((this->m_recvThread).m_isRunning != true) {
          de::Socket::connect(&this->m_socket,__fd,__addr_00,__len);
          TcpIpLinkState::setState(this_00,COMMLINKSTATE_READY,"");
          TcpIpLinkState::onKeepaliveReceived(this_00);
          de::BlockBuffer<unsigned_char>::clear(&(this->m_sendThread).m_buffer);
          (this->m_sendThread).m_isRunning = true;
          de::Thread::start(&(this->m_sendThread).super_Thread);
          (this->m_recvThread).m_curMsgPos = 0;
          (this->m_recvThread).m_isRunning = true;
          de::Thread::start(&(this->m_recvThread).super_Thread);
          dVar3 = deTimer_scheduleInterval(this->m_keepaliveTimer,5000);
          if (dVar3 != 0) {
            return dVar3;
          }
          pEVar4 = (Error *)__cxa_allocate_exception(0x10);
          Error::Error(pEVar4,(char *)0x0,
                       "deTimer_scheduleInterval(m_keepaliveTimer, xs::KEEPALIVE_SEND_INTERVAL)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                       ,0x1dd);
          __cxa_throw(pEVar4,&Error::typeinfo,std::runtime_error::~runtime_error);
        }
        pEVar4 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(pEVar4,(char *)0x0,"!m_recvThread.isRunning()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                     ,0x1cf);
      }
    }
    else {
      pEVar4 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(pEVar4,(char *)0x0,"m_state.getState() == COMMLINKSTATE_ERROR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x1cd);
    }
  }
  else {
    pEVar4 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(pEVar4,(char *)0x0,"m_socket.getState() == DE_SOCKETSTATE_CLOSED",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                 ,0x1cc);
  }
  __cxa_throw(pEVar4,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TcpIpLink::connect (const de::SocketAddress& address)
{
	XE_CHECK(m_socket.getState() == DE_SOCKETSTATE_CLOSED);
	XE_CHECK(m_state.getState() == COMMLINKSTATE_ERROR);
	XE_CHECK(!m_sendThread.isRunning());
	XE_CHECK(!m_recvThread.isRunning());

	m_socket.connect(address);

	try
	{
		// Clear error and set state to ready.
		m_state.setState(COMMLINKSTATE_READY, "");
		m_state.onKeepaliveReceived();

		// Launch threads.
		m_sendThread.start();
		m_recvThread.start();

		XE_CHECK(deTimer_scheduleInterval(m_keepaliveTimer, xs::KEEPALIVE_SEND_INTERVAL));
	}
	catch (const std::exception& e)
	{
		closeConnection();
		m_state.setState(COMMLINKSTATE_ERROR, e.what());
		throw;
	}
}